

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O0

MPP_RET hal_jpege_vepu_init_rc(HalJpegeRc *hal_rc)

{
  RK_U8 *pRVar1;
  HalJpegeRc *hal_rc_local;
  
  memset(hal_rc,0,0x20);
  pRVar1 = (RK_U8 *)mpp_osal_malloc("hal_jpege_vepu_init_rc",0x40);
  hal_rc->qtable_y = pRVar1;
  pRVar1 = (RK_U8 *)mpp_osal_malloc("hal_jpege_vepu_init_rc",0x40);
  hal_rc->qtable_c = pRVar1;
  if ((hal_rc->qtable_y == (RK_U8 *)0x0) || (hal_rc->qtable_c == (RK_U8 *)0x0)) {
    _mpp_log_l(2,"hal_jpege_base","qtable is null, malloc err\n","hal_jpege_vepu_init_rc");
    hal_rc_local._4_4_ = MPP_ERR_MALLOC;
  }
  else {
    hal_rc_local._4_4_ = MPP_OK;
  }
  return hal_rc_local._4_4_;
}

Assistant:

MPP_RET hal_jpege_vepu_init_rc(HalJpegeRc *hal_rc)
{
    memset(hal_rc, 0, sizeof(HalJpegeRc));
    hal_rc->qtable_y = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);
    hal_rc->qtable_c = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);

    if (NULL == hal_rc->qtable_y || NULL == hal_rc->qtable_c) {
        mpp_err_f("qtable is null, malloc err\n");
        return MPP_ERR_MALLOC;
    }

    return MPP_OK;
}